

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O1

void __thiscall OmegaOP::algoUNIMODAL(OmegaOP *this,vector<double,_std::allocator<double>_> *data)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  double **ppdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint u;
  double dVar10;
  uint local_64;
  Costs cost;
  uint local_5c;
  uint local_58;
  uint local_54;
  double local_50;
  ulong local_48;
  void *local_40;
  double local_38;
  
  uVar6 = (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_48 = uVar6 >> 3;
  uVar8 = (ulong)this->nbStates;
  Costs::Costs(&cost);
  pvVar2 = operator_new__(uVar8 * 8);
  if (uVar8 != 0) {
    uVar7 = 0;
    do {
      pvVar3 = operator_new__(uVar6 >> 1 & 0x3fffffffc);
      *(void **)((long)pvVar2 + uVar7 * 8) = pvVar3;
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
  ppdVar4 = preprocessing(this,data);
  this->S12P = ppdVar4;
  uVar1 = (int)local_48 + 1;
  local_48 = (ulong)uVar1;
  local_64 = 2;
  pvVar3 = pvVar2;
  if (2 < uVar1) {
    do {
      local_40 = pvVar3;
      if (uVar8 != 0) {
        uVar6 = 0;
        do {
          local_5c = 1;
          local_58 = 0;
          local_50 = INFINITY;
          local_54 = 0;
          if (1 < local_64) {
            local_54 = 0;
            local_58 = 0;
            local_50 = INFINITY;
            do {
              uVar7 = 0;
              do {
                if ((uVar6 <= uVar7) ||
                   (*(int *)(*(long *)((long)local_40 + uVar7 * 8) + (ulong)local_5c * 4) != -1)) {
                  uVar5 = (ulong)local_5c;
                  local_38 = this->Q[uVar7][uVar5];
                  ppdVar4 = this->S12P;
                  uVar9 = (ulong)local_64;
                  dVar10 = Costs::slopeCost(&cost,this->states + uVar7,this->states + uVar6,
                                            &local_5c,&local_64,*ppdVar4 + uVar5,*ppdVar4 + uVar9,
                                            ppdVar4[1] + uVar5,ppdVar4[1] + uVar9,ppdVar4[2] + uVar5
                                            ,ppdVar4[2] + uVar9);
                  dVar10 = dVar10 + local_38 + this->penalty;
                  if (dVar10 < local_50) {
                    local_58 = local_5c;
                    local_54 = (uint)uVar7;
                    local_50 = dVar10;
                  }
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 != uVar8);
              local_5c = local_5c + 1;
            } while (local_5c < local_64);
          }
          this->Q[uVar6][local_64] = local_50;
          this->lastIndState[uVar6][local_64] = local_54;
          this->lastChpt[uVar6][local_64] = local_58;
          uVar7 = (ulong)local_54;
          if (uVar6 < uVar7) {
            *(undefined4 *)(*(long *)((long)local_40 + uVar6 * 8) + (ulong)local_64 * 4) =
                 0xffffffff;
          }
          if (uVar7 < uVar6) {
            *(undefined4 *)(*(long *)((long)local_40 + uVar6 * 8) + (ulong)local_64 * 4) = 1;
          }
          if ((uVar6 == uVar7) &&
             (*(int *)(*(long *)((long)local_40 + uVar7 * 8) + (long)(int)local_58 * 4) == -1)) {
            *(undefined4 *)(*(long *)((long)local_40 + uVar6 * 8) + (ulong)local_64 * 4) =
                 0xffffffff;
          }
          uVar6 = uVar6 + 1;
          pvVar2 = local_40;
        } while (uVar6 != uVar8);
      }
      local_64 = local_64 + 1;
      pvVar3 = local_40;
    } while (local_64 < (uint)local_48);
  }
  this->pruning = 1.0;
  if (uVar8 != 0) {
    uVar6 = 0;
    do {
      pvVar3 = *(void **)((long)pvVar2 + uVar6 * 8);
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3);
      }
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  operator_delete__(pvVar2);
  return;
}

Assistant:

void OmegaOP::algoUNIMODAL(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  int** SLOPE = new int*[p];
  for(unsigned int i = 0; i < p; i++){SLOPE[i] = new int[n];}

  /// PREPROCESSING
  S12P = preprocessing(data);

  ///
  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        for(unsigned int u = 0; u < p; u++) /////explore column of states
        {
          if(!(u < v && SLOPE[u][t] == -1))
          {
            temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
            if(temp_Q > temp_cost)
            {
              temp_Q = temp_cost;
              temp_indState = u;
              temp_chpt = t;
            }
          }
        }

      }
      /////
      ///// Write response
      /////
      Q[v][T] = temp_Q;
      lastIndState[v][T] = temp_indState;
      lastChpt[v][T] = temp_chpt;

      if(temp_indState > v){SLOPE[v][T] = -1;}
      if(temp_indState < v){SLOPE[v][T] = 1;}
      if(temp_indState == v){if(SLOPE[temp_indState][temp_chpt] == -1){SLOPE[v][T] = -1;}}
    }
  }

  pruning = 1;

  for(unsigned int i = 0; i < p; i++){delete(SLOPE[i]);}
  delete [] SLOPE;
  SLOPE = NULL;

}